

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat operator*(Mat *left,Mat *right)

{
  long in_RDX;
  Mat *extraout_RDX;
  Mat *pMVar1;
  Mat MVar2;
  int local_3c;
  int local_38;
  int k;
  int j;
  int i;
  double Sum;
  Mat *right_local;
  Mat *left_local;
  Mat *Aux;
  
  Mat::Mat(left,right->n_rows_,*(int *)(in_RDX + 4));
  pMVar1 = extraout_RDX;
  for (k = 0; k < right->n_rows_; k = k + 1) {
    for (local_38 = 0; local_38 < *(int *)(in_RDX + 4); local_38 = local_38 + 1) {
      _j = 0.0;
      for (local_3c = 0; local_3c < right->n_cols_; local_3c = local_3c + 1) {
        _j = right->v_[k * right->n_cols_ + local_3c] *
             *(double *)
              (*(long *)(in_RDX + 8) + (long)(local_3c * *(int *)(in_RDX + 4) + local_38) * 8) + _j;
      }
      left->v_[k * left->n_cols_ + local_38] = _j;
      pMVar1 = left;
    }
  }
  MVar2.v_ = (double *)pMVar1;
  MVar2._0_8_ = left;
  return MVar2;
}

Assistant:

Mat operator * (const Mat& left, const Mat& right)
{
	Mat Aux(left.n_rows_, right.n_cols_);
	double Sum;
	for (int i=0; i<left.n_rows_; i++) 
		for (int j=0; j<right.n_cols_; j++)
		{
			Sum = 0.0;
			for (int k=0; k<left.n_cols_; k++) 
			Sum += left.v_[i*left.n_cols_+k] * right.v_[k*right.n_cols_+j];
			Aux.v_[i*Aux.n_cols_+j] = Sum;
		}
	return Aux;
}